

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file.cpp
# Opt level: O2

void duckdb::ReadTextFunction::RegisterFunction(BuiltinFunctions *set)

{
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_24a;
  allocator local_249;
  LogicalType local_248;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_230;
  string local_218;
  FunctionSet<duckdb::TableFunction> local_1f8;
  TableFunction local_1c0;
  
  ::std::__cxx11::string::string((string *)&local_218,"read_text",&local_249);
  LogicalType::LogicalType(&local_248,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_248;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_230,__l,&local_24a);
  TableFunction::TableFunction
            (&local_1c0,&local_218,(vector<duckdb::LogicalType,_true> *)&local_230,
             ReadFileExecute<duckdb::ReadTextOperation>,ReadFileBind<duckdb::ReadTextOperation>,
             ReadFileInitGlobal,(table_function_init_local_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_230);
  LogicalType::~LogicalType(&local_248);
  ::std::__cxx11::string::~string((string *)&local_218);
  local_1c0.table_scan_progress = ReadFileProgress;
  local_1c0.cardinality = ReadFileCardinality;
  local_1c0.projection_pushdown = true;
  MultiFileReader::CreateFunctionSet((TableFunctionSet *)&local_1f8,&local_1c0);
  BuiltinFunctions::AddFunction(set,(TableFunctionSet *)&local_1f8);
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_1f8);
  TableFunction::~TableFunction(&local_1c0);
  return;
}

Assistant:

void ReadTextFunction::RegisterFunction(BuiltinFunctions &set) {
	set.AddFunction(MultiFileReader::CreateFunctionSet(GetFunction<ReadTextOperation>()));
}